

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::
     pair_associative_container_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
               (string *type,Module *m)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  std::operator+(&local_38,type,"_Pair");
  pair_type<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void pair_associative_container_type(const std::string &type, Module &m) {
    pair_type<typename ContainerType::value_type>(type + "_Pair", m);
  }